

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetInternals::AddDirectoryToFileSet<std::__cxx11::string>
          (cmTargetInternals *this,cmTarget *self,string *fileSetName,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          string_view fileSetType,string_view description,Action action)

{
  cmMakefile *pcVar1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  cmFileSet *this_00;
  bool bVar2;
  string *this_01;
  undefined1 local_120 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_f0;
  string_view local_c0;
  string local_b0;
  __node_base local_90;
  size_t local_88;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_80;
  string local_60;
  cmFileSet *local_40;
  cmFileSet *fileSet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  string *fileSetName_local;
  cmTarget *self_local;
  cmTargetInternals *this_local;
  string_view fileSetType_local;
  
  fileSetType_local._M_len = (size_t)fileSetType._M_str;
  this_local = (cmTargetInternals *)fileSetType._M_len;
  fileSet = (cmFileSet *)value;
  value_local = fileSetName;
  fileSetName_local = (string *)self;
  self_local = (cmTarget *)this;
  local_40 = cmTarget::GetFileSet(self,fileSetName);
  if (local_40 == (cmFileSet *)0x0) {
    pcVar1 = this->Makefile;
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[26]>
              (&local_60,&description,(char (*) [26])0x113e40a);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    this_01 = cmFileSet::GetType_abi_cxx11_(local_40);
    local_80 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
    local_90._M_nxt = (_Hash_node_base *)this_local;
    local_88 = fileSetType_local._M_len;
    __y._M_str = (char *)fileSetType_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar2 = std::operator!=(local_80,__y);
    if (bVar2) {
      pcVar1 = this->Makefile;
      cmStrCat<char_const(&)[11],std::__cxx11::string_const&,char_const(&)[19],std::basic_string_view<char,std::char_traits<char>>&,char_const(&)[3]>
                (&local_b0,(char (*) [11])"File set \"",value_local,
                 (char (*) [19])"\" is not of type \"",
                 (basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                 (char (*) [3])0x11185a2);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    else {
      if (action == Set) {
        cmFileSet::ClearDirectoryEntries(local_40);
      }
      local_c0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)value);
      bVar2 = cmNonempty(local_c0);
      this_00 = local_40;
      if (bVar2) {
        std::__cxx11::string::string((string *)(local_120 + 0x10),(string *)value);
        cmMakefile::GetBacktrace((cmMakefile *)local_120);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_120 + 0x30),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_120 + 0x10),(cmListFileBacktrace *)local_120);
        cmFileSet::AddDirectoryEntry
                  (this_00,(BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(local_120 + 0x30));
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_120 + 0x30));
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_120);
        std::__cxx11::string::~string((string *)(local_120 + 0x10));
      }
    }
  }
  return;
}

Assistant:

void cmTargetInternals::AddDirectoryToFileSet(cmTarget* self,
                                              std::string const& fileSetName,
                                              ValueType value,
                                              cm::string_view fileSetType,
                                              cm::string_view description,
                                              FileSetType::Action action)
{
  auto* fileSet = self->GetFileSet(fileSetName);
  if (!fileSet) {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(description, "has not yet been created."));
    return;
  }
  if (fileSet->GetType() != fileSetType) {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat("File set \"", fileSetName,
                                          "\" is not of type \"", fileSetType,
                                          "\"."));
    return;
  }
  if (action == FileSetType::Action::Set) {
    fileSet->ClearDirectoryEntries();
  }
  if (cmNonempty(value)) {
    fileSet->AddDirectoryEntry(
      BT<std::string>(value, this->Makefile->GetBacktrace()));
  }
}